

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find_first_of
          (StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  size_type sVar2;
  bool *table;
  char *pcVar3;
  size_type i;
  StringPiece characters_wanted;
  size_type sStack_140;
  bool lookup [256];
  
  pcVar3 = (char *)s.length_;
  uVar1 = this->length_;
  table = (bool *)CONCAT71((int7)(pos >> 8),pcVar3 == (char *)0x0 || uVar1 == 0);
  if (pcVar3 == (char *)0x0 || uVar1 == 0) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    if (pcVar3 == (char *)0x1) {
      sVar2 = find(this,(char)*(stringpiece_internal *)s.ptr_,pos);
      return sVar2;
    }
    memset(lookup,0,0x100);
    characters_wanted.length_ = (size_type)lookup;
    characters_wanted.ptr_ = pcVar3;
    BuildLookupTable((stringpiece_internal *)s.ptr_,characters_wanted,table);
    sStack_140 = 0xffffffffffffffff;
    while ((sVar2 = sStack_140, pos < uVar1 && (sVar2 = pos, lookup[(byte)this->ptr_[pos]] == false)
           )) {
      pos = pos + 1;
    }
  }
  return sVar2;
}

Assistant:

StringPiece::size_type StringPiece::find_first_of(StringPiece s,
                                                  size_type pos) const {
  if (empty() || s.empty()) {
    return npos;
  }
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (size_type i = pos; i < length_; ++i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}